

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::concat<kj::String,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,String *params,FixedArray<char,_1UL> *params_1)

{
  size_t size;
  char *target;
  String *first;
  FixedArray<char,_1UL> *rest;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_48;
  size_t local_40;
  _ *local_38;
  undefined8 local_30;
  undefined1 local_21;
  String *local_20;
  FixedArray<char,_1UL> *params_local_1;
  String *params_local;
  String *result;
  
  local_21 = 0;
  local_20 = params;
  params_local_1 = (FixedArray<char,_1UL> *)this;
  params_local = __return_storage_ptr__;
  local_48 = String::size((String *)this);
  local_40 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)local_20);
  local_38 = (_ *)&local_48;
  local_30 = 2;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x2;
  size = sum(local_38,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::String>((NoInfer<kj::String> *)params_local_1);
  rest = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)local_20);
  fill<kj::String,kj::FixedArray<char,1ul>>(target,first,rest);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}